

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * cmGeneratorExpressionNode::EvaluateDependentExpression
                   (string *__return_storage_ptr__,string *prop,cmLocalGenerator *lg,
                   cmGeneratorExpressionContext *context,cmGeneratorTarget *headTarget,
                   cmGeneratorExpressionDAGChecker *dagChecker,cmGeneratorTarget *currentTarget)

{
  bool bVar1;
  pointer pcVar2;
  string *psVar3;
  string local_90 [32];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmListFileBacktrace local_58;
  undefined1 local_48 [8];
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorTarget *headTarget_local;
  cmGeneratorExpressionContext *context_local;
  cmLocalGenerator *lg_local;
  string *prop_local;
  string *result;
  
  ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dagChecker;
  cmListFileBacktrace::cmListFileBacktrace(&local_58,&context->Backtrace);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_48,&local_58);
  cmListFileBacktrace::~cmListFileBacktrace(&local_58);
  std::__cxx11::string::string(local_90,(string *)prop);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&stack0xffffffffffffff90,(string *)local_48)
  ;
  std::__cxx11::string::~string(local_90);
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  cmCompiledGeneratorExpression::SetEvaluateForBuildsystem
            (pcVar2,(bool)(context->EvaluateForBuildsystem & 1));
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  cmCompiledGeneratorExpression::SetQuiet(pcVar2,(bool)(context->Quiet & 1));
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  psVar3 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar2,lg,&context->Config,headTarget,
                      (cmGeneratorExpressionDAGChecker *)
                      ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,currentTarget,&context->Language);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  bVar1 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar2);
  if (bVar1) {
    context->HadContextSensitiveCondition = true;
  }
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar2);
  if (bVar1) {
    context->HadHeadSensitiveCondition = true;
  }
  pcVar2 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffff90);
  bVar1 = cmCompiledGeneratorExpression::GetHadLinkLanguageSensitiveCondition(pcVar2);
  if (bVar1) {
    context->HadLinkLanguageSensitiveCondition = true;
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&stack0xffffffffffffff90);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionNode::EvaluateDependentExpression(
  std::string const& prop, cmLocalGenerator* lg,
  cmGeneratorExpressionContext* context, cmGeneratorTarget const* headTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  cmGeneratorTarget const* currentTarget)
{
  cmGeneratorExpression ge(context->Backtrace);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);
  cge->SetEvaluateForBuildsystem(context->EvaluateForBuildsystem);
  cge->SetQuiet(context->Quiet);
  std::string result =
    cge->Evaluate(lg, context->Config, headTarget, dagChecker, currentTarget,
                  context->Language);
  if (cge->GetHadContextSensitiveCondition()) {
    context->HadContextSensitiveCondition = true;
  }
  if (cge->GetHadHeadSensitiveCondition()) {
    context->HadHeadSensitiveCondition = true;
  }
  if (cge->GetHadLinkLanguageSensitiveCondition()) {
    context->HadLinkLanguageSensitiveCondition = true;
  }
  return result;
}